

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

float make_qp_quants(int n,int nmax,float *x,uint8_t *L,float *quant_weights)

{
  float *pfVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  int in_EDI;
  long in_R8;
  float fVar3;
  float fVar4;
  float fVar5;
  int new_l;
  float sl2;
  float slx;
  float w_3;
  int i_6;
  int n_changed;
  int itry;
  float w_2;
  int l_1;
  int i_5;
  float suml2;
  float sumlx;
  float w_1;
  float diff_1;
  int l;
  int i_4;
  float mse;
  float scale_is;
  float iscale_is;
  int is;
  float w;
  float diff;
  int i_3;
  float best_mse;
  float scale;
  int i_2;
  float iscale;
  int i_1;
  int i;
  float max;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  float local_a4;
  int local_90;
  int local_8c;
  int local_88;
  int local_7c;
  float local_78;
  float local_74;
  int local_64;
  float local_60;
  int local_54;
  int local_48;
  float local_44;
  int local_3c;
  float local_38;
  int local_34;
  int local_30;
  float local_2c;
  float local_4;
  
  local_2c = 0.0;
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    pfVar1 = (float *)(in_RDX + (long)local_30 * 4);
    if (local_2c < *pfVar1 || local_2c == *pfVar1) {
      local_a4 = *(float *)(in_RDX + (long)local_30 * 4);
    }
    else {
      local_a4 = local_2c;
    }
    local_2c = local_a4;
  }
  if ((local_2c != 0.0) || (NAN(local_2c))) {
    local_38 = (float)(int)in_ESI / local_2c;
    for (local_3c = 0; local_3c < in_EDI; local_3c = local_3c + 1) {
      iVar2 = nearest_int(local_38 * *(float *)(in_RDX + (long)local_3c * 4));
      *(char *)(in_RCX + local_3c) = (char)iVar2;
    }
    local_44 = 0.0;
    for (local_48 = 0; local_48 < in_EDI; local_48 = local_48 + 1) {
      fVar3 = -(1.0 / local_38) * (float)*(byte *)(in_RCX + local_48) +
              *(float *)(in_RDX + (long)local_48 * 4);
      local_44 = *(float *)(in_R8 + (long)local_48 * 4) * fVar3 * fVar3 + local_44;
    }
    for (local_54 = -4; local_54 < 5; local_54 = local_54 + 1) {
      if (local_54 != 0) {
        fVar3 = ((float)local_54 * 0.1 + (float)(int)in_ESI) / local_2c;
        local_60 = 0.0;
        for (local_64 = 0; local_64 < in_EDI; local_64 = local_64 + 1) {
          local_a8 = nearest_int(fVar3 * *(float *)(in_RDX + (long)local_64 * 4));
          if ((int)in_ESI < (int)local_a8) {
            local_a8 = in_ESI;
          }
          fVar4 = -(1.0 / fVar3) * (float)(int)local_a8 + *(float *)(in_RDX + (long)local_64 * 4);
          local_60 = *(float *)(in_R8 + (long)local_64 * 4) * fVar4 * fVar4 + local_60;
        }
        if (local_60 < local_44) {
          local_44 = local_60;
          local_38 = fVar3;
        }
      }
    }
    local_74 = 0.0;
    local_78 = 0.0;
    for (local_7c = 0; local_7c < in_EDI; local_7c = local_7c + 1) {
      local_ac = nearest_int(local_38 * *(float *)(in_RDX + (long)local_7c * 4));
      if ((int)in_ESI < (int)local_ac) {
        local_ac = in_ESI;
      }
      *(char *)(in_RCX + local_7c) = (char)local_ac;
      fVar3 = *(float *)(in_R8 + (long)local_7c * 4);
      local_74 = fVar3 * *(float *)(in_RDX + (long)local_7c * 4) * (float)(int)local_ac + local_74;
      local_78 = fVar3 * (float)(int)local_ac * (float)(int)local_ac + local_78;
    }
    for (local_88 = 0; local_88 < 5; local_88 = local_88 + 1) {
      local_8c = 0;
      for (local_90 = 0; local_90 < in_EDI; local_90 = local_90 + 1) {
        fVar3 = *(float *)(in_R8 + (long)local_90 * 4);
        fVar4 = -(fVar3 * *(float *)(in_RDX + (long)local_90 * 4)) *
                (float)*(byte *)(in_RCX + local_90) + local_74;
        fVar5 = -(fVar3 * (float)*(byte *)(in_RCX + local_90)) * (float)*(byte *)(in_RCX + local_90)
                + local_78;
        if ((0.0 < fVar4) && (0.0 < fVar5)) {
          local_b0 = nearest_int((*(float *)(in_RDX + (long)local_90 * 4) * fVar5) / fVar4);
          if ((int)in_ESI < (int)local_b0) {
            local_b0 = in_ESI;
          }
          if (local_b0 != *(byte *)(in_RCX + local_90)) {
            fVar4 = fVar3 * *(float *)(in_RDX + (long)local_90 * 4) * (float)(int)local_b0 + fVar4;
            fVar5 = fVar3 * (float)(int)local_b0 * (float)(int)local_b0 + fVar5;
            if (local_74 * local_74 * fVar5 < fVar4 * fVar4 * local_78) {
              *(char *)(in_RCX + local_90) = (char)local_b0;
              local_8c = local_8c + 1;
              local_78 = fVar5;
              local_74 = fVar4;
            }
          }
        }
      }
      if (local_8c == 0) break;
    }
    local_4 = local_74 / local_78;
  }
  else {
    for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
      *(undefined1 *)(in_RCX + local_34) = 0;
    }
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float make_qp_quants(int n, int nmax, const float * GGML_RESTRICT x, uint8_t * GGML_RESTRICT L, const float * quant_weights) {
    float max = 0;
    for (int i = 0; i < n; ++i) {
        max = MAX(max, x[i]);
    }
    if (!max) { // all zero
        for (int i = 0; i < n; ++i) { L[i] = 0; }
        return 0.f;
    }
    float iscale = nmax / max;
    for (int i = 0; i < n; ++i) {
        L[i] = nearest_int(iscale * x[i]);
    }
    float scale = 1/iscale;
    float best_mse = 0;
    for (int i = 0; i < n; ++i) {
        float diff = x[i] - scale*L[i];
        float w = quant_weights[i];
        best_mse += w*diff*diff;
    }
    for (int is = -4; is <= 4; ++is) {
        if (is == 0) continue;
        float iscale_is = (0.1f*is + nmax)/max;
        float scale_is = 1/iscale_is;
        float mse = 0;
        for (int i = 0; i < n; ++i) {
            int l = nearest_int(iscale_is*x[i]);
            l = MIN(nmax, l);
            float diff = x[i] - scale_is*l;
            float w = quant_weights[i];
            mse += w*diff*diff;
        }
        if (mse < best_mse) {
            best_mse = mse;
            iscale = iscale_is;
        }
    }
    float sumlx = 0;
    float suml2 = 0;
    for (int i = 0; i < n; ++i) {
        int l = nearest_int(iscale * x[i]);
        l = MIN(nmax, l);
        L[i] = l;
        float w = quant_weights[i];
        sumlx += w*x[i]*l;
        suml2 += w*l*l;
    }
    for (int itry = 0; itry < 5; ++itry) {
        int n_changed = 0;
        for (int i = 0; i < n; ++i) {
            float w = quant_weights[i];
            float slx = sumlx - w*x[i]*L[i];
            float sl2 = suml2 - w*L[i]*L[i];
            if (slx > 0 && sl2 > 0) {
                int new_l = nearest_int(x[i] * sl2 / slx);
                new_l = MIN(nmax, new_l);
                if (new_l != L[i]) {
                    slx += w*x[i]*new_l;
                    sl2 += w*new_l*new_l;
                    if (slx*slx*suml2 > sumlx*sumlx*sl2) {
                        L[i] = new_l; sumlx = slx; suml2 = sl2;
                        ++n_changed;
                    }
                }
            }
        }
        if (!n_changed) {
            break;
        }
    }
    return sumlx/suml2;
}